

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Vec<float,_3UL> *v)

{
  code *pcVar1;
  ostream *poVar2;
  uint local_1c;
  int i;
  Vec<float,_3UL> *v_local;
  ostream *os_local;
  
  std::operator<<(os,'[');
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,v->data[(int)local_1c]);
    std::operator<<(poVar2,", ");
  }
  poVar2 = (ostream *)std::ostream::operator<<(os,v->data[2]);
  std::operator<<(poVar2,']');
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }